

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

int __thiscall libtorrent::aux::torrent::num_downloaders(torrent *this)

{
  int iVar1;
  
  iVar1 = num_peers(this);
  return (iVar1 - ((uint)this->m_num_connecting + (uint)this->m_num_seeds)) +
         (uint)this->m_num_connecting_seeds;
}

Assistant:

int torrent::num_downloaders() const
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		int const ret = num_peers()
			- m_num_seeds
			- m_num_connecting
			+ m_num_connecting_seeds;
		TORRENT_ASSERT(ret >= 0);
		return ret;
	}